

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O0

void __thiscall FConsoleBuffer::FreeBrokenText(FConsoleBuffer *this,uint start,uint end)

{
  uint uVar1;
  FBrokenLines **ppFVar2;
  uint local_1c;
  uint local_18;
  uint i;
  uint end_local;
  uint start_local;
  FConsoleBuffer *this_local;
  
  uVar1 = TArray<FBrokenLines_*,_FBrokenLines_*>::Size(&this->mBrokenConsoleText);
  local_1c = start;
  local_18 = end;
  if (uVar1 < end) {
    local_18 = TArray<FBrokenLines_*,_FBrokenLines_*>::Size(&this->mBrokenConsoleText);
  }
  for (; local_1c < local_18; local_1c = local_1c + 1) {
    ppFVar2 = TArray<FBrokenLines_*,_FBrokenLines_*>::operator[]
                        (&this->mBrokenConsoleText,(ulong)local_1c);
    if (*ppFVar2 != (FBrokenLines *)0x0) {
      ppFVar2 = TArray<FBrokenLines_*,_FBrokenLines_*>::operator[]
                          (&this->mBrokenConsoleText,(ulong)local_1c);
      V_FreeBrokenLines(*ppFVar2);
    }
    ppFVar2 = TArray<FBrokenLines_*,_FBrokenLines_*>::operator[]
                        (&this->mBrokenConsoleText,(ulong)local_1c);
    *ppFVar2 = (FBrokenLines *)0x0;
  }
  return;
}

Assistant:

void FConsoleBuffer::FreeBrokenText(unsigned start, unsigned end)
{
	if (end > mBrokenConsoleText.Size()) end = mBrokenConsoleText.Size();
	for (unsigned i = start; i < end; i++)
	{
		if (mBrokenConsoleText[i] != NULL) V_FreeBrokenLines(mBrokenConsoleText[i]);
		mBrokenConsoleText[i] = NULL;
	}
}